

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.h
# Opt level: O3

RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> __thiscall
capnp::
makeRpcServer<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>
          (capnp *this,
          VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>
          *network,Client *bootstrapInterface)

{
  undefined8 uVar1;
  Impl *extraout_RDX;
  Impl *extraout_RDX_00;
  Impl *pIVar2;
  RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> RVar3;
  Maybe<capnp::Capability::Client> local_20;
  
  local_20.ptr.isSet = true;
  local_20.ptr.field_1.value.hook.disposer = (bootstrapInterface->hook).disposer;
  local_20.ptr.field_1.value.hook.ptr = (bootstrapInterface->hook).ptr;
  (bootstrapInterface->hook).ptr = (ClientHook *)0x0;
  RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId>::
  RpcSystem<capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>
            ((RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> *)this,network,&local_20);
  uVar1 = local_20.ptr.field_1.value.hook.ptr;
  pIVar2 = extraout_RDX;
  if ((local_20.ptr.isSet == true) && (local_20.ptr.field_1.value.hook.ptr != (ClientHook *)0x0)) {
    local_20.ptr.field_1.value.hook.ptr = (ClientHook *)0x0;
    (**(local_20.ptr.field_1.value.hook.disposer)->_vptr_Disposer)
              (local_20.ptr.field_1.value.hook.disposer,
               (_func_int *)
               ((long)&((ClientHook *)uVar1)->_vptr_ClientHook +
               (long)((ClientHook *)uVar1)->_vptr_ClientHook[-2]));
    pIVar2 = extraout_RDX_00;
  }
  RVar3.super_RpcSystemBase.impl.ptr = pIVar2;
  RVar3.super_RpcSystemBase.impl.disposer = (Disposer *)this;
  return (RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId>)RVar3.super_RpcSystemBase.impl
  ;
}

Assistant:

RpcSystem<VatId> makeRpcServer(
    VatNetwork<VatId, ThirdPartyCompletion, ThirdPartyToAwait, ThirdPartyToContact,
               JoinResult>& network,
    Capability::Client bootstrapInterface) {
  return RpcSystem<VatId>(network, kj::mv(bootstrapInterface));
}